

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hive_partitioning.cpp
# Opt level: O3

void duckdb::HivePartitioning::ApplyFiltersToFileList
               (ClientContext *context,vector<duckdb::OpenFileInfo,_true> *files,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *filters,HivePartitioningFilterInfo *filter_info,MultiFilePushdownInfo *info)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  ulong *puVar2;
  pointer pcVar3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ulong uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  optional_idx oVar11;
  undefined4 uVar12;
  bool bVar13;
  int iVar14;
  const_iterator cVar15;
  _Base_ptr p_Var16;
  reference this;
  pointer pEVar17;
  type expr;
  InternalException *pIVar18;
  _Alloc_hider _Var19;
  size_type __n;
  pointer *__ptr;
  idx_t index;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar20;
  Value result_value;
  vector<duckdb::OpenFileInfo,_true> pruned_files;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  pruned_filters;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  partitions;
  unordered_map<unsigned_long,_duckdb::PartitioningColumnValue,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::PartitioningColumnValue>_>_>
  known_values;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filters_applied_to_files;
  undefined1 local_278 [20];
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258;
  undefined8 local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined1 local_238 [32];
  Val VStack_218;
  tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_> local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  HivePartitioningFilterInfo *local_1f0;
  MultiFilePushdownInfo *local_1e8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1e0;
  pointer local_1d8;
  undefined1 local_1d0 [16];
  _Alloc_hider local_1c0;
  BaseStatistics *local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  optional_idx local_1a0;
  reference local_198;
  element_type *local_190;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> local_168;
  pointer local_148;
  pointer puStack_140;
  pointer local_138;
  ClientContext *local_128;
  size_type local_120;
  idx_t local_118;
  void *local_110 [2];
  long local_100;
  uint local_f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e8;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::PartitioningColumnValue>,_std::allocator<std::pair<const_unsigned_long,_duckdb::PartitioningColumnValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_b8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_80;
  LogicalType local_48;
  
  local_168.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238._0_8_ = local_238._0_8_ & 0xffffffffffffff00;
  local_128 = context;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_110,
             (long)(filters->
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(filters->
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)local_238,
             (allocator_type *)local_278);
  local_148 = (pointer)0x0;
  puStack_140 = (pointer)0x0;
  local_138 = (pointer)0x0;
  local_80._M_buckets = &local_80._M_single_bucket;
  local_80._M_bucket_count = 1;
  local_80._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_80._M_element_count = 0;
  local_80._M_rehash_policy._M_max_load_factor = 1.0;
  local_80._M_rehash_policy._M_next_resize = 0;
  local_80._M_single_bucket = (__node_base_ptr)0x0;
  local_118 = info->table_index;
  if (((filter_info->filename_enabled != false) || (filter_info->hive_enabled == true)) &&
     ((filters->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (filters->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    local_1a0.index = (idx_t)files;
    if ((files->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
        super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (files->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
        super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
        super__Vector_impl_data._M_start) {
      index = 0;
    }
    else {
      __n = 0;
      local_1f0 = filter_info;
      local_1e8 = info;
      do {
        local_120 = __n;
        local_198 = vector<duckdb::OpenFileInfo,_true>::operator[]
                              ((vector<duckdb::OpenFileInfo,_true> *)local_1a0.index,__n);
        local_b8._M_buckets = &local_b8._M_single_bucket;
        local_b8._M_bucket_count = 1;
        local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_b8._M_element_count = 0;
        local_b8._M_rehash_policy._M_max_load_factor = 1.0;
        local_b8._M_rehash_policy._M_next_resize = 0;
        local_b8._M_single_bucket = (__node_base_ptr)0x0;
        if (local_1f0->filename_enabled == true) {
          local_238._16_8_ = (pointer)0x656d616e656c6966;
          local_238._8_8_ = (Expression *)0x8;
          local_238._24_8_ = local_238._24_8_ & 0xffffffffffffff00;
          local_238._0_8_ = local_238 + 0x10;
          cVar15 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)local_1f0,(key_type *)local_238);
          if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
            operator_delete((void *)local_238._0_8_);
          }
          if (cVar15.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
              ._M_cur != (__node_type *)0x0) {
            pcVar3 = (local_198->path)._M_dataplus._M_p;
            local_1c0._M_p = (pointer)&local_1b0;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_1d0 + 0x10),pcVar3,
                       pcVar3 + (local_198->path)._M_string_length);
            local_208.
            super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
            .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                  )(_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                    )local_1b8;
            uVar8 = stack0xfffffffffffffd98;
            uVar7 = (ulong)stack0xfffffffffffffd98 >> 8;
            stack0xfffffffffffffd98 = uVar7 << 8;
            uVar9 = stack0xfffffffffffffd98;
            local_258 = &local_248;
            local_238._8_8_ = local_238 + 0x18;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_p == &local_1b0) {
              local_248._8_8_ = local_1b0._8_8_;
              local_1c0._M_p = (pointer)local_258;
            }
            local_248._M_allocated_capacity._1_7_ = local_1b0._M_allocated_capacity._1_7_;
            local_248._M_local_buf[0] = local_1b0._M_local_buf[0];
            local_1b8 = (BaseStatistics *)0x0;
            local_1b0._M_local_buf[0] = '\0';
            local_238._0_8_ =
                 *(long *)((long)cVar15.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                 ._M_cur + 0x28);
            uStack_264 = SUB84(uVar8,4);
            local_238._24_8_ = CONCAT44(uStack_264,(int)uVar9);
            VStack_218.integer = uStack_260;
            VStack_218.interval.days = uStack_25c;
            local_238._16_8_ = (pointer)0x0;
            local_278._8_8_ = 0;
            stack0xfffffffffffffd98 = uVar7 << 8;
            VStack_218._8_8_ = local_1c0._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_p == local_258) {
              local_200._8_4_ = local_248._8_4_;
              local_200._12_4_ = local_248._12_4_;
              VStack_218.hugeint.upper = (int64_t)&local_200;
            }
            local_200._M_allocated_capacity = local_248._M_allocated_capacity;
            local_250 = 0;
            local_248._M_allocated_capacity =
                 (ulong)(uint7)local_1b0._M_allocated_capacity._1_7_ << 8;
            local_278._0_8_ = (Expression *)(local_278 + 0x10);
            local_1c0._M_p = (pointer)&local_1b0;
            ::std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::PartitioningColumnValue>,std::allocator<std::pair<unsigned_long_const,duckdb::PartitioningColumnValue>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<unsigned_long,duckdb::PartitioningColumnValue>>
                      ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::PartitioningColumnValue>,std::allocator<std::pair<unsigned_long_const,duckdb::PartitioningColumnValue>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&local_b8);
            if (VStack_218._8_8_ != &local_200) {
              operator_delete((void *)VStack_218.hugeint.upper);
            }
            if ((Expression *)local_238._8_8_ != (Expression *)(local_238 + 0x18)) {
              operator_delete((void *)local_238._8_8_);
            }
            if (local_258 != &local_248) {
              operator_delete(local_258);
            }
            if ((Expression *)local_278._0_8_ != (Expression *)(local_278 + 0x10)) {
              operator_delete((void *)local_278._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_p != &local_1b0) {
              operator_delete(local_1c0._M_p);
            }
          }
        }
        if (local_1f0->hive_enabled == true) {
          Parse((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_e8,&local_198->path);
          for (p_Var16 = local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
              p_Var16 != (_Rb_tree_node_base *)((long)&local_e8 + 8U);
              p_Var16 = (_Base_ptr)::std::_Rb_tree_increment(p_Var16)) {
            cVar15 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)local_1f0,(key_type *)(p_Var16 + 1));
            if (cVar15.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                ._M_cur != (__node_type *)0x0) {
              local_1e0._M_head_impl = (Expression *)local_1d0;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1e0,*(long *)(p_Var16 + 1),
                         (long)&(p_Var16[1]._M_parent)->_M_color + *(long *)(p_Var16 + 1));
              local_188._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_178;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_188,*(long *)(p_Var16 + 2),
                         (long)&(p_Var16[2]._M_parent)->_M_color + *(long *)(p_Var16 + 2));
              uVar12 = local_178._M_allocated_capacity._0_4_;
              local_208.
              super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
              .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
                   (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                    )(_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                      )local_180._M_t.
                       super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                       .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
              uVar10 = local_1d0._0_4_;
              local_238._16_8_ = local_1d8;
              if (local_1e0._M_head_impl == (Expression *)local_1d0) {
                local_1e0._M_head_impl = (Expression *)(local_278 + 0x10);
                uStack_260 = local_1d0._8_4_;
                uStack_25c = local_1d0._12_4_;
              }
              uStack_264 = local_1d0._4_4_;
              local_278._16_4_ = local_1d0._0_4_;
              local_1d8 = (pointer)0x0;
              local_1d0._0_4_ = local_1d0._0_4_ & 0xffffff00;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_pi == &local_178) {
                local_188._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_248;
                local_248._12_4_ = local_178._12_4_;
                local_248._8_4_ = local_178._8_4_;
              }
              local_248._M_allocated_capacity._4_4_ = local_178._M_allocated_capacity._4_4_;
              local_248._M_allocated_capacity._0_4_ = local_178._M_allocated_capacity._0_4_;
              local_180._M_t.
              super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
              .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
                   (__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
                    )0x0;
              local_178._M_allocated_capacity._0_4_ =
                   local_178._M_allocated_capacity._0_4_ & 0xffffff00;
              local_238._0_8_ =
                   *(long *)((long)cVar15.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                   ._M_cur + 0x28);
              local_238._8_8_ = local_238 + 0x18;
              _Var1._M_head_impl = (Expression *)(local_278 + 0x10);
              if (local_1e0._M_head_impl == _Var1._M_head_impl) {
                local_238._24_8_ = CONCAT44(local_1d0._4_4_,uVar10);
                VStack_218.integer = uStack_260;
                VStack_218.interval.days = uStack_25c;
              }
              else {
                local_238._24_8_ = stack0xfffffffffffffd98;
                local_238._8_8_ = local_1e0._M_head_impl;
              }
              local_278._8_8_ = 0;
              stack0xfffffffffffffd98 = stack0xfffffffffffffd98 & 0xffffffffffffff00;
              VStack_218.hugeint.upper = (int64_t)&local_200;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_pi == &local_248) {
                local_200._M_allocated_capacity =
                     CONCAT44(local_178._M_allocated_capacity._4_4_,uVar12);
                local_200._8_4_ = local_248._8_4_;
                local_200._12_4_ = local_248._12_4_;
              }
              else {
                local_200._M_allocated_capacity = local_248._M_allocated_capacity;
                VStack_218._8_8_ = local_188._M_pi;
              }
              local_250 = 0;
              local_248._M_allocated_capacity = local_248._M_allocated_capacity & 0xffffffffffffff00
              ;
              local_278._0_8_ = _Var1._M_head_impl;
              local_258 = &local_248;
              local_1e0._M_head_impl = (Expression *)local_1d0;
              local_188._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_178;
              ::std::
              _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::PartitioningColumnValue>,std::allocator<std::pair<unsigned_long_const,duckdb::PartitioningColumnValue>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<std::pair<unsigned_long,duckdb::PartitioningColumnValue>>
                        ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::PartitioningColumnValue>,std::allocator<std::pair<unsigned_long_const,duckdb::PartitioningColumnValue>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)&local_b8);
              if (VStack_218._8_8_ != &local_200) {
                operator_delete((void *)VStack_218.hugeint.upper);
              }
              if ((Expression *)local_238._8_8_ != (Expression *)(local_238 + 0x18)) {
                operator_delete((void *)local_238._8_8_);
              }
              if (local_258 != &local_248) {
                operator_delete(local_258);
              }
              if ((Expression *)local_278._0_8_ != _Var1._M_head_impl) {
                operator_delete((void *)local_278._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_pi != &local_178) {
                operator_delete(local_188._M_pi);
              }
              if (local_1e0._M_head_impl != (Expression *)local_1d0) {
                operator_delete(local_1e0._M_head_impl);
              }
            }
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_e8);
        }
        local_1c0._M_p = (pointer)0x0;
        info = local_1e8;
        if ((filters->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (filters->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
LAB_00e5bf70:
          std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::push_back
                    (&local_168,local_198);
        }
        else {
          local_190 = (element_type *)0x0;
          do {
            this = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::operator[](filters,(size_type)local_1c0._M_p);
            pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->(this);
            (*(pEVar17->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_1e0,pEVar17);
            ConvertKnownColRefToConstants
                      (local_128,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_1e0,
                       (unordered_map<unsigned_long,_duckdb::PartitioningColumnValue,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::PartitioningColumnValue>_>_>
                        *)&local_b8,local_118);
            LogicalType::LogicalType(&local_48,SQLNULL);
            Value::Value((Value *)local_238,&local_48);
            LogicalType::~LogicalType(&local_48);
            pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                    *)&local_1e0);
            iVar14 = (*(pEVar17->super_BaseExpression)._vptr_BaseExpression[5])(pEVar17);
            if ((char)iVar14 == '\0') {
LAB_00e5bd82:
              _Var19._M_p = local_1c0._M_p;
              paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)((ulong)local_f8 + (local_100 - (long)local_110[0]) * 8);
              if (paVar6 <= local_1c0._M_p) {
                pIVar18 = (InternalException *)__cxa_allocate_exception(0x10);
                local_278._0_8_ = (long)local_278 + 0x10;
                local_e8._M_impl._0_8_ = &DAT_00000037;
                local_278._0_8_ =
                     ::std::__cxx11::string::_M_create((ulong *)local_278,(ulong)&local_e8);
                stack0xfffffffffffffd98 = local_e8._M_impl._0_8_;
                builtin_strncpy((char *)(local_278._0_8_ + 0x20),"thin vec",8);
                builtin_strncpy((char *)(local_278._0_8_ + 0x28),"tor of s",8);
                builtin_strncpy((char *)(local_278._0_8_ + 0x10),"ess inde",8);
                builtin_strncpy((char *)(local_278._0_8_ + 0x18),"x %ld wi",8);
                *(undefined8 *)local_278._0_8_ = 0x6574706d65747441;
                builtin_strncpy((char *)(local_278._0_8_ + 8),"d to acc",8);
                builtin_strncpy((char *)(local_278._0_8_ + 0x2f),"size %ld",8);
                local_278._8_8_ = local_e8._M_impl._0_8_;
                *(undefined1 *)(local_e8._M_impl._0_8_ + local_278._0_8_) = 0;
                InternalException::InternalException<unsigned_long,unsigned_long>
                          (pIVar18,(string *)local_278,(unsigned_long)_Var19._M_p,
                           (unsigned_long)paVar6);
                __cxa_throw(pIVar18,&InternalException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              _Var19._M_p = (pointer)(local_1c0._M_p + 0x3f);
              if (-1 < (long)local_1c0._M_p) {
                _Var19._M_p = local_1c0._M_p;
              }
              info = local_1e8;
              if ((*(ulong *)((long)local_110[0] +
                             (ulong)(((ulong)local_1c0._M_p & 0x800000000000003f) <
                                    0x8000000000000001) * 8 + ((long)_Var19._M_p >> 6) * 8 + -8) >>
                   ((ulong)local_1c0._M_p & 0x3f) & 1) == 0) {
                pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          ::operator->(this);
                (*(pEVar17->super_BaseExpression)._vptr_BaseExpression[0x11])(local_278,pEVar17);
                ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                          ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                            *)&local_148,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_278);
                if ((Expression *)local_278._0_8_ != (Expression *)0x0) {
                  (**(code **)(*(long *)local_278._0_8_ + 8))();
                }
                _Var19._M_p = local_1c0._M_p;
                paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)((ulong)local_f8 + (local_100 - (long)local_110[0]) * 8);
                if (paVar6 <= local_1c0._M_p) {
                  pIVar18 = (InternalException *)__cxa_allocate_exception(0x10);
                  local_278._0_8_ = (long)local_278 + 0x10;
                  local_e8._M_impl._0_8_ = &DAT_00000037;
                  local_278._0_8_ =
                       ::std::__cxx11::string::_M_create((ulong *)local_278,(ulong)&local_e8);
                  stack0xfffffffffffffd98 = local_e8._M_impl._0_8_;
                  builtin_strncpy((char *)(local_278._0_8_ + 0x20),"thin vec",8);
                  builtin_strncpy((char *)(local_278._0_8_ + 0x28),"tor of s",8);
                  builtin_strncpy((char *)(local_278._0_8_ + 0x10),"ess inde",8);
                  builtin_strncpy((char *)(local_278._0_8_ + 0x18),"x %ld wi",8);
                  *(undefined8 *)local_278._0_8_ = 0x6574706d65747441;
                  builtin_strncpy((char *)(local_278._0_8_ + 8),"d to acc",8);
                  builtin_strncpy((char *)(local_278._0_8_ + 0x2f),"size %ld",8);
                  local_278._8_8_ = local_e8._M_impl._0_8_;
                  *(undefined1 *)(local_e8._M_impl._0_8_ + local_278._0_8_) = 0;
                  InternalException::InternalException<unsigned_long,unsigned_long>
                            (pIVar18,(string *)local_278,(unsigned_long)_Var19._M_p,
                             (unsigned_long)paVar6);
                  __cxa_throw(pIVar18,&InternalException::typeinfo,
                              ::std::runtime_error::~runtime_error);
                }
                _Var19._M_p = (pointer)(local_1c0._M_p + 0x3f);
                if (-1 < (long)local_1c0._M_p) {
                  _Var19._M_p = local_1c0._M_p;
                }
                puVar2 = (ulong *)((long)local_110[0] +
                                  (ulong)(((ulong)local_1c0._M_p & 0x800000000000003f) <
                                         0x8000000000000001) * 8 + ((long)_Var19._M_p >> 6) * 8 + -8
                                  );
                *puVar2 = *puVar2 | 1L << ((byte)local_1c0._M_p & 0x3f);
                info = local_1e8;
              }
            }
            else {
              pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                      *)&local_1e0);
              iVar14 = (*(pEVar17->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar17);
              if ((char)iVar14 == '\0') goto LAB_00e5bd82;
              expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)&local_1e0);
              bVar13 = ExpressionExecutor::TryEvaluateScalar(local_128,expr,(Value *)local_238);
              if (!bVar13) goto LAB_00e5bd82;
              if ((local_238[0x18] != '\0') ||
                 (bVar13 = Value::GetValue<bool>((Value *)local_238), !bVar13)) {
                p_Var4 = local_80._M_buckets[(ulong)local_1c0._M_p % local_80._M_bucket_count];
                if (p_Var4 != (__node_base_ptr)0x0) {
                  p_Var5 = p_Var4->_M_nxt;
                  local_190 = (element_type *)CONCAT71((int7)((ulong)p_Var4 >> 8),1);
                  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)p_Var5[1]._M_nxt;
                  do {
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c0._M_p == paVar6) goto LAB_00e5beb2;
                    p_Var5 = p_Var5->_M_nxt;
                  } while ((p_Var5 != (_Hash_node_base *)0x0) &&
                          (paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)p_Var5[1]._M_nxt,
                          (ulong)paVar6 % local_80._M_bucket_count ==
                          (ulong)local_1c0._M_p % local_80._M_bucket_count));
                }
                pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          ::operator->(this);
                (*(pEVar17->super_BaseExpression)._vptr_BaseExpression[8])(local_278,pEVar17);
                ::std::__cxx11::string::_M_append((char *)info->extra_info,local_278._0_8_);
                if ((Expression *)local_278._0_8_ != (Expression *)(local_278 + 0x10)) {
                  operator_delete((void *)local_278._0_8_);
                }
                local_278._0_8_ = &local_80;
                pVar20 = ::std::
                         _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                         ::
                         _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                                   ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                     *)local_278._0_8_,local_1d0 + 0x10,local_278);
                local_190 = (element_type *)
                            CONCAT71(pVar20.first.super__Node_iterator_base<unsigned_long,_false>.
                                     _M_cur._1_7_,1);
              }
            }
LAB_00e5beb2:
            Value::~Value((Value *)local_238);
            if (local_1e0._M_head_impl != (Expression *)0x0) {
              (*(code *)((local_1e0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
            }
            local_1c0._M_p = local_1c0._M_p + 1;
          } while (local_1c0._M_p <
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)(filters->
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ).
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(filters->
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ).
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3));
          if (((ulong)local_190 & 1) == 0) goto LAB_00e5bf70;
        }
        std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::PartitioningColumnValue>,_std::allocator<std::pair<const_unsigned_long,_duckdb::PartitioningColumnValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_b8);
        __n = local_120 + 1;
        index = ((long)*(pointer *)(local_1a0.index + 8) - *(long *)local_1a0.index >> 4) *
                -0x5555555555555555;
      } while (__n < index);
    }
    optional_idx::optional_idx((optional_idx *)local_238,index);
    (info->extra_info->total_files).index = local_238._0_8_;
    optional_idx::optional_idx
              ((optional_idx *)local_238,
               ((long)local_168.
                      super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_168.
                      super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
    oVar11.index = local_1a0.index;
    (info->extra_info->filtered_files).index = local_238._0_8_;
    local_238._16_8_ =
         (filters->
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ).
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (filters->
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ).
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_138;
    local_238._0_8_ =
         (filters->
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ).
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_238._8_8_ =
         (filters->
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ).
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (filters->
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ).
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_148;
    (filters->
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ).
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puStack_140;
    local_148 = (pointer)0x0;
    puStack_140 = (pointer)0x0;
    local_138 = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_238);
    local_238._16_8_ = *(pointer *)(oVar11.index + 0x10);
    *(pointer *)(oVar11.index + 0x10) =
         local_168.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_238._0_8_ = *(undefined8 *)oVar11.index;
    local_238._8_8_ = *(pointer *)(oVar11.index + 8);
    *(pointer *)oVar11.index =
         local_168.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
         _M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(oVar11.index + 8) =
         local_168.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_168.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
              ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)local_238);
  }
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_80);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_148);
  if (local_110[0] != (void *)0x0) {
    operator_delete(local_110[0]);
  }
  std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector(&local_168);
  return;
}

Assistant:

void HivePartitioning::ApplyFiltersToFileList(ClientContext &context, vector<OpenFileInfo> &files,
                                              vector<unique_ptr<Expression>> &filters,
                                              const HivePartitioningFilterInfo &filter_info,
                                              MultiFilePushdownInfo &info) {

	vector<OpenFileInfo> pruned_files;
	vector<bool> have_preserved_filter(filters.size(), false);
	vector<unique_ptr<Expression>> pruned_filters;
	unordered_set<idx_t> filters_applied_to_files;
	auto table_index = info.table_index;

	if ((!filter_info.filename_enabled && !filter_info.hive_enabled) || filters.empty()) {
		return;
	}

	for (idx_t i = 0; i < files.size(); i++) {
		auto &file = files[i];
		bool should_prune_file = false;
		auto known_values = GetKnownColumnValues(file.path, filter_info);

		for (idx_t j = 0; j < filters.size(); j++) {
			auto &filter = filters[j];
			unique_ptr<Expression> filter_copy = filter->Copy();
			ConvertKnownColRefToConstants(context, filter_copy, known_values, table_index);
			// Evaluate the filter, if it can be evaluated here, we can not prune this filter
			Value result_value;

			if (!filter_copy->IsScalar() || !filter_copy->IsFoldable() ||
			    !ExpressionExecutor::TryEvaluateScalar(context, *filter_copy, result_value)) {
				// can not be evaluated only with the filename/hive columns added, we can not prune this filter
				if (!have_preserved_filter[j]) {
					pruned_filters.emplace_back(filter->Copy());
					have_preserved_filter[j] = true;
				}
			} else if (result_value.IsNull() || !result_value.GetValue<bool>()) {
				// filter evaluates to false
				should_prune_file = true;
				// convert the filter to a table filter.
				if (filters_applied_to_files.find(j) == filters_applied_to_files.end()) {
					info.extra_info.file_filters += filter->ToString();
					filters_applied_to_files.insert(j);
				}
			}
		}

		if (!should_prune_file) {
			pruned_files.push_back(file);
		}
	}

	D_ASSERT(filters.size() >= pruned_filters.size());

	info.extra_info.total_files = files.size();
	info.extra_info.filtered_files = pruned_files.size();

	filters = std::move(pruned_filters);
	files = std::move(pruned_files);
}